

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O1

QString * __thiscall
AbstractStringSerialiserPrivate::saveVariant
          (QString *__return_storage_ptr__,AbstractStringSerialiserPrivate *this,QVariant *val)

{
  PrivateShared *pPVar1;
  char cVar2;
  bool bVar3;
  QChar QVar4;
  int iVar5;
  undefined4 uVar6;
  char16_t *pcVar7;
  QMetaType QVar8;
  DateFormat DVar9;
  QMetaType in_stack_ffffffffffffffa8;
  QByteArray local_50;
  anon_union_24_3_e3d07ef4_for_data local_38;
  double local_20;
  
  cVar2 = ::QVariant::isNull();
  if (cVar2 != '\0') {
switchD_0012092d_caseD_0:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
  iVar5 = ::QVariant::typeId(val);
  if (iVar5 < 0x1001) {
    DVar9 = (DateFormat)__return_storage_ptr__;
    switch(iVar5) {
    case 0:
      goto switchD_0012092d_caseD_0;
    case 1:
      cVar2 = ::QVariant::toBool();
      (__return_storage_ptr__->d).d = (Data *)0x0;
      if (cVar2 == '\0') {
        pcVar7 = L"0";
      }
      else {
        pcVar7 = L"1";
      }
      (__return_storage_ptr__->d).ptr = pcVar7;
      (__return_storage_ptr__->d).size = 1;
      break;
    case 2:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x28:
      iVar5 = ::QVariant::toInt((bool *)val);
      QString::number(DVar9,iVar5);
      break;
    case 3:
    case 0x23:
    case 0x24:
    case 0x25:
      iVar5 = ::QVariant::toUInt((bool *)val);
      QString::number(DVar9,iVar5);
      break;
    case 4:
      iVar5 = ::QVariant::toLongLong((bool *)val);
      QString::number((longlong)__return_storage_ptr__,iVar5);
      break;
    case 5:
      iVar5 = ::QVariant::toULongLong((bool *)val);
      QString::number((ulonglong)__return_storage_ptr__,iVar5);
      break;
    case 6:
    case 0x26:
      local_20 = (double)::QVariant::toDouble((bool *)val);
      guessDecimals(local_20);
      QString::number(local_20,(char)__return_storage_ptr__,0x66);
      break;
    case 7:
      QVar4.ucs = ::QVariant::toChar();
      QString::QString(__return_storage_ptr__,QVar4);
      break;
    default:
      goto switchD_0012092d_caseD_8;
    case 10:
      ::QVariant::toString();
      break;
    case 0xc:
      ::QVariant::toByteArray();
      QByteArray::toBase64(&local_50,&local_38,0);
      QString::fromLatin1<void>(__return_storage_ptr__,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,8);
        }
      }
      if ((QArrayData *)local_38.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_38.shared = *(int *)local_38.shared + -1;
        UNLOCK();
        if (*(int *)local_38.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_38.shared,1,8);
        }
      }
      break;
    case 0xe:
      local_50.d.d = (Data *)::QVariant::toDate();
      QDate::toString(DVar9);
      break;
    case 0xf:
      uVar6 = ::QVariant::toTime();
      local_50.d.d = (Data *)CONCAT44(local_50.d.d._4_4_,uVar6);
      QTime::toString(DVar9);
      break;
    case 0x10:
      ::QVariant::toDateTime();
      QDateTime::toString(DVar9);
      QDateTime::~QDateTime((QDateTime *)&local_50);
    }
  }
  else {
    if (iVar5 == 0x1001) {
      ::QVariant::value<QPixmap>((QVariant *)&local_38);
      QPixmap::toImage();
      saveImageVariant(__return_storage_ptr__,(QImage *)&local_50);
      QImage::~QImage((QImage *)&local_50);
      QPixmap::~QPixmap((QPixmap *)&local_38);
      return __return_storage_ptr__;
    }
    if (iVar5 == 0x1006) {
      ::QVariant::value<QImage>((QVariant *)&local_50);
      saveImageVariant(__return_storage_ptr__,(QImage *)&local_50);
      QImage::~QImage((QImage *)&local_50);
      return __return_storage_ptr__;
    }
    if (iVar5 == 0x1009) {
      bVar3 = operator==(in_stack_ffffffffffffffa8,(QMetaType)0x12099a);
      if (bVar3) {
        if (((val->d).field_0x18 & 1) != 0) {
          pPVar1 = (val->d).data.shared;
          val = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
        }
        QPixmap::QPixmap((QPixmap *)&local_38,(QPixmap *)val);
        local_38.shared = (PrivateShared *)&PTR__QPixmap_00167a78;
      }
      else {
        QBitmap::QBitmap((QBitmap *)&local_38);
        QVar8.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if (((val->d).field_0x18 & 1) != 0) {
          pPVar1 = (val->d).data.shared;
          val = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
        }
        QMetaType::convert(QVar8,val,(QMetaType)0x169bb8,&local_38);
      }
      QPixmap::toImage();
      saveImageVariant(__return_storage_ptr__,(QImage *)&local_50);
      QImage::~QImage((QImage *)&local_50);
      QPixmap::~QPixmap((QPixmap *)&local_38);
      return __return_storage_ptr__;
    }
switchD_0012092d_caseD_8:
    variantToString(__return_storage_ptr__,this,val);
  }
  return __return_storage_ptr__;
}

Assistant:

QString AbstractStringSerialiserPrivate::saveVariant(const QVariant &val) const
{
    if (val.isNull())
        return QString();
    switch (val.userType()) {
    case QMetaType::UnknownType:
        Q_ASSERT_X(false, "ModelSerialisation::saveVariant", "Trying to save unregistered type.");
        return QString();
    case QMetaType::Bool:
        return val.toBool() ? QStringLiteral("1") : QStringLiteral("0");
    case QMetaType::Long:
    case QMetaType::Short:
    case QMetaType::Char:
    case QMetaType::SChar:
    case QMetaType::Int:
        return QString::number(val.toInt());
    case QMetaType::ULong:
    case QMetaType::UShort:
    case QMetaType::UChar:
    case QMetaType::UInt:
        return QString::number(val.toUInt());
    case QMetaType::LongLong:
        return QString::number(val.toLongLong());
    case QMetaType::ULongLong:
        return QString::number(val.toULongLong());
    case QMetaType::Double:
    case QMetaType::Float:
        return guessDecimalsString(val.toDouble());
    case QMetaType::QChar:
        return QString(val.toChar());
    case QMetaType::QString:
        return val.toString();
    case QMetaType::QByteArray:
        return QString::fromLatin1(val.toByteArray().toBase64());
    case QMetaType::QDate:
        return val.toDate().toString(Qt::ISODate);
    case QMetaType::QTime:
        return val.toTime().toString(Qt::ISODate);
    case QMetaType::QDateTime:
        return val.toDateTime().toString(Qt::ISODate);
#ifdef QT_GUI_LIB
    case QMetaType::QImage:
        return saveImageVariant(val.value<QImage>());
    case QMetaType::QPixmap:
        return saveImageVariant(val.value<QPixmap>().toImage());
    case QMetaType::QBitmap:
        return saveImageVariant(val.value<QBitmap>().toImage());
#endif
    default:
        return variantToString(val);
    }
}